

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

int dasm_link(BuildCtx *ctx,size_t *szp)

{
  int iVar1;
  int iVar2;
  dasm_State *pdVar3;
  uint uVar4;
  int *piVar5;
  dasm_Section *pdVar6;
  byte *pbVar7;
  int local_8c;
  int local_80;
  int i;
  int lpos;
  int lofs;
  int shrink;
  int action;
  int op;
  dasm_ActList p;
  int lastpos;
  int pos;
  int *b;
  dasm_Section *sec;
  int *pb;
  int local_38;
  int n;
  int idx;
  int pc;
  int ofs;
  int secnum;
  dasm_State *D;
  size_t *szp_local;
  BuildCtx *ctx_local;
  
  pdVar3 = ctx->D;
  idx = 0;
  *szp = 0;
  if (pdVar3->status == 0) {
    for (n = 0; (ulong)((long)n << 2) < pdVar3->pcsize; n = n + 1) {
      if (0 < pdVar3->pclabels[n]) {
        return n | 0x22000000;
      }
    }
    for (local_38 = 10; (ulong)((long)local_38 << 2) < pdVar3->lgsize; local_38 = local_38 + 1) {
      pb._4_4_ = pdVar3->lglabels[local_38];
      while (0 < pb._4_4_) {
        piVar5 = pdVar3->sections[pb._4_4_ >> 0x18].rbuf + pb._4_4_;
        pb._4_4_ = *piVar5;
        *piVar5 = -local_38;
      }
    }
    for (pc = 0; pc < pdVar3->maxsection; pc = pc + 1) {
      pdVar6 = pdVar3->sections + pc;
      piVar5 = pdVar6->rbuf;
      p._4_4_ = pc << 0x18;
      iVar1 = pdVar6->pos;
LAB_00106385:
      if (p._4_4_ != iVar1) {
        shrink = 0;
        uVar4 = shrink;
        pbVar7 = pdVar3->actionlist + piVar5[p._4_4_];
        p._4_4_ = p._4_4_ + 1;
switchD_001063fa_default:
        _action = pbVar7;
        shrink = uVar4;
        pbVar7 = _action + 1;
        uVar4 = (uint)*_action;
        switch((uint)*_action) {
        case 0xf0:
        case 0xf1:
        case 0xf6:
          pbVar7 = _action + 2;
          break;
        case 0xf4:
          pbVar7 = _action + 2;
        case 0xf5:
          _action = pbVar7;
          if (shrink == 0xe9) {
            local_8c = 3;
          }
          else {
            local_8c = 0;
            if ((shrink & 0xf0U) == 0x80) {
              local_8c = 4;
            }
          }
          lpos = local_8c;
          if (local_8c != 0) {
            iVar2 = piVar5[p._4_4_];
            if (-1 < iVar2) {
              i = pdVar3->sections[iVar2 >> 0x18].rbuf[iVar2];
              if (p._4_4_ < iVar2) {
                for (local_80 = pc; local_80 < iVar2 >> 0x18; local_80 = local_80 + 1) {
                  i = pdVar3->sections[local_80].ofs + i;
                }
              }
              else {
                i = i - idx;
              }
              if ((-0x80 - local_8c <= i - piVar5[p._4_4_ + 1]) && (i - piVar5[p._4_4_ + 1] < 0x80))
              {
                idx = idx - local_8c;
                goto LAB_00106522;
              }
            }
            lpos = 0;
          }
LAB_00106522:
          piVar5[p._4_4_ + 1] = lpos;
          p._4_4_ = p._4_4_ + 2;
          uVar4 = shrink;
          pbVar7 = _action;
          goto switchD_001063fa_default;
        case 0xf8:
          pbVar7 = _action + 2;
        case 0xf9:
          _action = pbVar7;
          piVar5[p._4_4_] = idx + piVar5[p._4_4_];
          uVar4 = shrink;
          pbVar7 = _action;
          p._4_4_ = p._4_4_ + 1;
          goto switchD_001063fa_default;
        case 0xfa:
          idx = idx - (piVar5[p._4_4_] + idx & (uint)*pbVar7);
          uVar4 = shrink;
          pbVar7 = _action + 2;
          p._4_4_ = p._4_4_ + 1;
          goto switchD_001063fa_default;
        case 0xfb:
          uVar4 = shrink;
          pbVar7 = _action + 3;
          goto switchD_001063fa_default;
        case 0xfc:
          uVar4 = (uint)*pbVar7;
          pbVar7 = _action + 2;
          goto switchD_001063fa_default;
        case 0xfd:
          goto switchD_001063fa_caseD_fd;
        case 0xfe:
        case 0xff:
          goto LAB_001065f0;
        default:
          goto switchD_001063fa_default;
        }
        _action = pbVar7;
        p._4_4_ = p._4_4_ + 1;
        uVar4 = shrink;
        pbVar7 = _action;
        goto switchD_001063fa_default;
      }
      idx = pdVar6->ofs + idx;
    }
    pdVar3->codesize = (long)idx;
    *szp = (long)idx;
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = pdVar3->status;
  }
  return ctx_local._4_4_;
LAB_001065f0:
  goto LAB_00106385;
switchD_001063fa_caseD_fd:
  uVar4 = shrink;
  goto switchD_001063fa_default;
}

Assistant:

int dasm_link(Dst_DECL, size_t *szp)
{
  dasm_State *D = Dst_REF;
  int secnum;
  int ofs = 0;

#ifdef DASM_CHECKS
  *szp = 0;
  if (D->status != DASM_S_OK) return D->status;
  {
    int pc;
    for (pc = 0; pc*sizeof(int) < D->pcsize; pc++)
      if (D->pclabels[pc] > 0) return DASM_S_UNDEF_PC|pc;
  }
#endif

  { /* Handle globals not defined in this translation unit. */
    int idx;
    for (idx = 10; idx*sizeof(int) < D->lgsize; idx++) {
      int n = D->lglabels[idx];
      /* Undefined label: Collapse rel chain and replace with marker (< 0). */
      while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = -idx; }
    }
  }

  /* Combine all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->rbuf;
    int pos = DASM_SEC2POS(secnum);
    int lastpos = sec->pos;

    while (pos != lastpos) {
      dasm_ActList p = D->actionlist + b[pos++];
      int op = 0;
      while (1) {
	int action = *p++;
	switch (action) {
	case DASM_REL_LG: p++;
	  /* fallthrough */
	case DASM_REL_PC: {
	  int shrink = op == 0xe9 ? 3 : ((op&0xf0) == 0x80 ? 4 : 0);
	  if (shrink) {  /* Shrinkable branch opcode? */
	    int lofs, lpos = b[pos];
	    if (lpos < 0) goto noshrink;  /* Ext global? */
	    lofs = *DASM_POS2PTR(D, lpos);
	    if (lpos > pos) {  /* Fwd label: add cumulative section offsets. */
	      int i;
	      for (i = secnum; i < DASM_POS2SEC(lpos); i++)
		lofs += D->sections[i].ofs;
	    } else {
	      lofs -= ofs;  /* Bkwd label: unfix offset. */
	    }
	    lofs -= b[pos+1];  /* Short branch ok? */
	    if (lofs >= -128-shrink && lofs <= 127) ofs -= shrink;  /* Yes. */
	    else { noshrink: shrink = 0; }  /* No, cannot shrink op. */
	  }
	  b[pos+1] = shrink;
	  pos += 2;
	  break;
	}
	  /* fallthrough */
	case DASM_SPACE: case DASM_IMM_LG: case DASM_VREG: p++;
	  /* fallthrough */
	case DASM_DISP: case DASM_IMM_S: case DASM_IMM_B: case DASM_IMM_W:
	case DASM_IMM_D: case DASM_IMM_WB: case DASM_IMM_DB:
	case DASM_SETLABEL: case DASM_REL_A: case DASM_IMM_PC: pos++; break;
	case DASM_LABEL_LG: p++;
	  /* fallthrough */
	case DASM_LABEL_PC: b[pos++] += ofs; break; /* Fix label offset. */
	case DASM_ALIGN: ofs -= (b[pos++]+ofs)&*p++; break; /* Adjust ofs. */
	case DASM_EXTERN: p += 2; break;
	case DASM_ESC: op = *p++; break;
	case DASM_MARK: break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	default: op = action; break;
	}
      }
      stop: (void)0;
    }
    ofs += sec->ofs;  /* Next section starts right after current section. */
  }

  D->codesize = ofs;  /* Total size of all code sections */
  *szp = ofs;
  return DASM_S_OK;
}